

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTagType(BinaryReader *this,Index *out_sig_index)

{
  Result RVar1;
  Enum EVar2;
  uint8_t attribute;
  uint32_t value;
  uint8_t local_1d;
  Index local_1c;
  
  RVar1 = ReadU8(this,&local_1d,"tag attribute");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (local_1d == '\0') {
      RVar1 = ReadU32Leb128(this,&local_1c,"tag signature index");
      if (RVar1.enum_ != Error) {
        *out_sig_index = local_1c;
        EVar2 = Ok;
      }
    }
    else {
      PrintError(this,"tag attribute must be 0");
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadTagType(Index* out_sig_index) {
  uint8_t attribute;
  CHECK_RESULT(ReadU8(&attribute, "tag attribute"));
  ERROR_UNLESS(attribute == 0, "tag attribute must be 0");
  CHECK_RESULT(ReadIndex(out_sig_index, "tag signature index"));
  return Result::Ok;
}